

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_test.c
# Opt level: O3

RK_S32 vpu_decode_demo(VpuApiDemoCmdContext_t *cmd)

{
  VPUMemLinear_t *pVVar1;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  VpuCodecContext_t *pVVar10;
  RK_S32 RVar11;
  uint uVar12;
  FILE *__stream;
  FILE *__s;
  RK_U8 *pRVar13;
  long lVar14;
  RK_U8 *buf;
  long lVar15;
  uint uVar16;
  undefined8 uVar17;
  char *pcVar18;
  int iVar19;
  RK_S32 pkt_size;
  RK_U32 extraSize;
  DecoderOut_t decOut;
  uint local_a8;
  uint local_a4;
  RK_U8 *local_a0;
  ulong local_98;
  ulong local_90;
  uint local_84;
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined8 local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  
  local_a8 = 0;
  local_a4 = 0;
  if (cmd == (VpuApiDemoCmdContext_t *)0x0) {
    return -1;
  }
  if (((((cmd->have_input == '\0') || (cmd->width == 0)) || (cmd->height == 0)) ||
      (cmd->coding < OMX_RK_VIDEO_CodingMPEG2)) &&
     (puts("Warning: missing needed parameters for vpu api demo"), cmd->have_input == '\0')) {
    pcVar18 = "please set input bitstream file";
  }
  else {
    pcVar18 = "encode";
    if (cmd->codec_type == CODEC_DECODER) {
      pcVar18 = "decode";
    }
    printf("input bitstream w: %d, h: %d, coding: %d(%s), path: %s\n",(ulong)cmd->width,
           (ulong)cmd->height,(ulong)cmd->coding,pcVar18,cmd->input_file);
    __stream = fopen(cmd->input_file,"rb");
    if (__stream != (FILE *)0x0) {
      if (cmd->have_output == '\0') {
        __s = (FILE *)0x0;
      }
      else {
        printf("vpu api demo output file: %s\n",cmd->output_file);
        __s = fopen(cmd->output_file,"wb");
        if (__s == (FILE *)0x0) {
          puts("can not write output file");
          uVar17 = 0xffffff9b;
          bVar9 = false;
          __s = (FILE *)0x0;
          goto LAB_0010197e;
        }
        if (cmd->record_frames == 0) {
          cmd->record_frames = 5;
        }
      }
      fseek(__stream,0,2);
      local_90 = ftell(__stream);
      fseek(__stream,0,0);
      local_70 = (undefined1  [16])0x0;
      local_60._0_4_ = 0;
      local_60._4_4_ = 0;
      local_80._0_8_ = -0x8000000000000000;
      local_80._8_8_ = -0x8000000000000000;
      local_58 = (undefined1  [16])0x0;
      local_48 = (undefined1  [16])0x0;
      RVar11 = (*vpuapi_open_ctx)(&ctx);
      uVar17 = 0xffffff98;
      bVar9 = false;
      pRVar13 = (RK_U8 *)0x0;
      if ((RVar11 == 0) && (ctx != (VpuCodecContext_t *)0x0)) {
        RVar11 = readBytesFromFile((RK_U8 *)&local_a4,4,(FILE *)__stream);
        uVar17 = 0xffffff99;
        if (RVar11 == 0) {
          printf("codec extra data size: %d\n",(ulong)local_a4);
          uVar12 = local_a4;
          pRVar13 = (RK_U8 *)calloc(1,(ulong)local_a4);
          if (pRVar13 != (RK_U8 *)0x0) {
            local_a0 = pRVar13;
            RVar11 = readBytesFromFile(pRVar13,uVar12,(FILE *)__stream);
            pRVar13 = local_a0;
            pVVar10 = ctx;
            if (RVar11 == 0) {
              uVar3 = cmd->width;
              uVar4 = cmd->height;
              uVar5 = cmd->codec_type;
              uVar6 = cmd->coding;
              pVVar10->codecType = uVar5;
              pVVar10->videoCoding = uVar6;
              pVVar10->width = uVar3;
              pVVar10->height = uVar4;
              pVVar10->no_thread = 1;
              uVar12 = (*pVVar10->init)(pVVar10,local_a0,local_a4);
              if (uVar12 == 0) {
                iVar19 = (int)local_90;
                printf("init vpu api context ok, fileSize: %d\n",local_90 & 0xffffffff);
                local_90 = (ulong)iVar19;
                local_98 = 0;
                local_38 = 0;
                do {
                  lVar14 = ftell(__stream);
                  if ((long)local_90 <= lVar14) {
                    puts("read end of file, complete");
                    uVar17 = 0;
                    bVar9 = true;
                    break;
                  }
                  if (local_70._8_4_ == 0) {
                    RVar11 = readBytesFromFile((RK_U8 *)&local_a8,4,(FILE *)__stream);
                    uVar12 = local_a8;
                    uVar17 = 0;
                    bVar9 = true;
                    if (RVar11 != 0) break;
                    if ((RK_U8 *)local_70._0_8_ == (RK_U8 *)0x0) {
                      buf = (RK_U8 *)malloc((long)(int)local_a8);
                      local_70._0_8_ = buf;
                      pRVar13 = local_a0;
joined_r0x00101b4f:
                      local_a0 = pRVar13;
                      if (buf == (RK_U8 *)0x0) {
                        uVar17 = 0xffffff98;
                        bVar9 = false;
                        goto LAB_00101940;
                      }
                      local_70._12_4_ = uVar12;
                    }
                    else {
                      buf = (RK_U8 *)local_70._0_8_;
                      if ((uint)local_70._12_4_ < local_a8) {
                        buf = (RK_U8 *)realloc((void *)local_70._0_8_,(long)(int)local_a8);
                        local_70._0_8_ = buf;
                        uVar12 = local_a8;
                        pRVar13 = local_a0;
                        goto joined_r0x00101b4f;
                      }
                    }
                    RVar11 = readBytesFromFile(buf,uVar12,(FILE *)__stream);
                    lVar14 = local_38;
                    uVar12 = local_a8;
                    pRVar13 = local_a0;
                    if (RVar11 != 0) break;
                    local_70._8_4_ = local_a8;
                    local_80._0_8_ = local_38;
                    lVar2 = local_38 + 40000;
                    lVar15 = ftell(__stream);
                    printf("read one packet, size: %d, pts: %lld, filePos: %ld\n",(ulong)uVar12,
                           lVar14,lVar15);
                    pRVar13 = local_a0;
                    local_38 = lVar2;
                  }
                  local_58._8_4_ = 0;
                  RVar11 = (*ctx->decode_sendstream)(ctx,(VideoPacket_t *)local_80);
                  if (RVar11 != 0) {
                    bVar9 = false;
                    printf("send packet failed");
                    uVar17 = 0xffffff42;
                    break;
                  }
                  RVar11 = (*ctx->decode_getframe)(ctx,(DecoderOut_t *)local_58);
                  if (RVar11 != 0) {
                    puts("get decoded data failed");
                    uVar17 = 0xffffff42;
                    bVar9 = false;
                    break;
                  }
                  printf("vpu decode one frame, out len: %d, left size: %d\n",
                         (ulong)(uint)local_58._8_4_,(ulong)(uint)local_70._8_4_);
                  if ((local_58._8_4_ != 0) &&
                     (uVar17 = local_58._0_8_, (RK_U8 *)local_58._0_8_ != (RK_U8 *)0x0)) {
                    pVVar1 = (VPUMemLinear_t *)(local_58._0_8_ + 0x40);
                    (*vpuapi_mem_link)(pVVar1);
                    uVar12 = (uint)local_98;
                    uVar16 = uVar12;
                    if ((__s != (FILE *)0x0) && (uVar16 = uVar12 + 1, uVar12 < cmd->record_frames))
                    {
                      uVar12 = (*(int *)(uVar17 + 0x1c) + 0xfU & 0xfffffff0) *
                               (*(int *)(uVar17 + 0x18) + 0xfU & 0xffffff0) * 3 >> 1;
                      local_84 = uVar16;
                      printf("write %d frame(yuv420sp) data, %d bytes to file\n",(ulong)uVar16,
                             (ulong)uVar12);
                      pRVar13 = local_a0;
                      fwrite(*(void **)(uVar17 + 0x48),1,(ulong)uVar12,__s);
                      fflush(__s);
                      uVar16 = local_84;
                    }
                    (*vpuapi_mem_free)(pVVar1);
                    free((void *)local_58._0_8_);
                    local_58._0_12_ = ZEXT812(0);
                    local_98 = (ulong)uVar16;
                  }
                  usleep(3000);
                  uVar17 = 0;
                  bVar9 = true;
                } while (ctx->decoder_err == 0);
              }
              else {
                bVar9 = false;
                printf("init vpu api context fail, ret: 0x%X\n",(ulong)uVar12);
                uVar17 = 0xffffff97;
              }
            }
            else {
              bVar9 = false;
            }
            goto LAB_00101928;
          }
          uVar17 = 0xffffff98;
        }
        bVar9 = false;
        pRVar13 = (RK_U8 *)0x0;
      }
LAB_00101928:
      if ((RK_U8 *)local_70._0_8_ != (RK_U8 *)0x0) {
        free((void *)local_70._0_8_);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_70._8_8_;
        local_70 = auVar7 << 0x40;
      }
LAB_00101940:
      if ((RK_U8 *)local_58._0_8_ != (RK_U8 *)0x0) {
        free((void *)local_58._0_8_);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_58._8_8_;
        local_58 = auVar8 << 0x40;
      }
      if (pRVar13 != (RK_U8 *)0x0) {
        free(pRVar13);
      }
      goto LAB_0010197e;
    }
    pcVar18 = "input file not exsist";
  }
  puts(pcVar18);
  uVar17 = 0xffffff9b;
  bVar9 = false;
  __s = (FILE *)0x0;
  __stream = (FILE *)0x0;
LAB_0010197e:
  if (ctx != (VpuCodecContext_t *)0x0) {
    (*vpuapi_close_ctx)(&ctx);
    ctx = (VpuCodecContext_t *)0x0;
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  if (__s != (FILE *)0x0) {
    fclose(__s);
  }
  if (bVar9) {
    puts("encode demo complete OK.");
  }
  else {
    printf("decode demo fail, err: %d\n",uVar17);
  }
  return (RK_S32)uVar17;
}

Assistant:

static RK_S32 vpu_decode_demo(VpuApiDemoCmdContext_t *cmd)
{
    FILE *pInFile = NULL;
    FILE *pOutFile = NULL;
    RK_S32 fileSize = 0, pkt_size = 0;
    RK_S32 ret = 0;
    RK_U32 frame_count = 0;
    DecoderOut_t    decOut;
    VideoPacket_t demoPkt;
    VideoPacket_t *pkt = NULL;
    DecoderOut_t *pOut = NULL;
    VPU_FRAME *frame = NULL;
    RK_S64 fakeTimeUs = 0;
    RK_U8 *pExtra = NULL;
    RK_U32 extraSize = 0;
    RK_U32 wAlign16  = 0;
    RK_U32 hAlign16  = 0;
    RK_U32 frameSize = 0;

    if (cmd == NULL) {
        return -1;
    }

    if ((cmd->have_input == 0) || (cmd->width <= 0) || (cmd->height <= 0)
        || (cmd->coding <= OMX_RK_VIDEO_CodingAutoDetect)) {
        printf("Warning: missing needed parameters for vpu api demo\n");
    }

    if (cmd->have_input) {
        printf("input bitstream w: %d, h: %d, coding: %d(%s), path: %s\n",
               cmd->width, cmd->height, cmd->coding,
               cmd->codec_type == CODEC_DECODER ? "decode" : "encode",
               cmd->input_file);

        pInFile = fopen(cmd->input_file, "rb");
        if (pInFile == NULL) {
            printf("input file not exsist\n");
            DECODE_ERR_RET(ERROR_INVALID_PARAM);
        }
    } else {
        printf("please set input bitstream file\n");
        DECODE_ERR_RET(ERROR_INVALID_PARAM);
    }

    if (cmd->have_output) {
        printf("vpu api demo output file: %s\n",
               cmd->output_file);
        pOutFile = fopen(cmd->output_file, "wb");
        if (pOutFile == NULL) {
            printf("can not write output file\n");
            DECODE_ERR_RET(ERROR_INVALID_PARAM);
        }
        if (cmd->record_frames == 0)
            cmd->record_frames = 5;
    }

    fseek(pInFile, 0L, SEEK_END);
    fileSize = ftell(pInFile);
    fseek(pInFile, 0L, SEEK_SET);

    memset(&demoPkt, 0, sizeof(VideoPacket_t));
    pkt = &demoPkt;
    pkt->data = NULL;
    pkt->pts = VPU_API_NOPTS_VALUE;
    pkt->dts = VPU_API_NOPTS_VALUE;

    memset(&decOut, 0, sizeof(DecoderOut_t));
    pOut = &decOut;

    ret = vpuapi_open_ctx(&ctx);
    if (ret || (ctx == NULL)) {
        DECODE_ERR_RET(ERROR_MEMORY);
    }

    /*
     ** read codec extra data from input stream file.
    */
    if (readBytesFromFile((RK_U8 *)(&extraSize), 4, pInFile)) {
        DECODE_ERR_RET(ERROR_IO);
    }

    printf("codec extra data size: %d\n", extraSize);

    pExtra = (RK_U8 *)(malloc)(extraSize);
    if (pExtra == NULL) {
        DECODE_ERR_RET(ERROR_MEMORY);
    }
    memset(pExtra, 0, extraSize);

    if (readBytesFromFile(pExtra, extraSize, pInFile)) {
        DECODE_ERR_RET(ERROR_IO);
    }

    /*
     ** now init vpu api context. codecType, codingType, width ,height
     ** are all needed before init.
    */
    ctx->codecType = cmd->codec_type;
    ctx->videoCoding = cmd->coding;
    ctx->width = cmd->width;
    ctx->height = cmd->height;
    ctx->no_thread = 1;

    if ((ret = ctx->init(ctx, pExtra, extraSize)) != 0) {
        printf("init vpu api context fail, ret: 0x%X\n", ret);
        DECODE_ERR_RET(ERROR_INIT_VPU);
    }

    /*
     ** vpu api decoder process.
    */
    printf("init vpu api context ok, fileSize: %d\n", fileSize);

    do {
        if (ftell(pInFile) >= fileSize) {
            printf("read end of file, complete\n");
            break;
        }

        if (pkt && (pkt->size == 0)) {
            if (readBytesFromFile((RK_U8 *)(&pkt_size), 4, pInFile)) {
                break;
            }

            if (pkt->data == NULL) {
                pkt->data = (RK_U8 *)(malloc)(pkt_size);
                if (pkt->data == NULL) {
                    DECODE_ERR_RET(ERROR_MEMORY);
                }
                pkt->capability = pkt_size;
            }

            if (pkt->capability < ((RK_U32)pkt_size)) {
                pkt->data = (RK_U8 *)(realloc)((void *)(pkt->data), pkt_size);
                if (pkt->data == NULL) {
                    DECODE_ERR_RET(ERROR_MEMORY);
                }
                pkt->capability = pkt_size;
            }

            if (readBytesFromFile(pkt->data, pkt_size, pInFile)) {
                break;
            } else {
                pkt->size = pkt_size;
                pkt->pts = fakeTimeUs;
                fakeTimeUs += 40000;
            }

            printf("read one packet, size: %d, pts: %lld, filePos: %ld\n",
                   pkt->size, pkt->pts, ftell(pInFile));
        }

        /* note: must set out put size to 0 before do decoder. */
        pOut->size = 0;

        if (ctx->decode_sendstream(ctx, pkt) != 0) {
            printf("send packet failed");
            DECODE_ERR_RET(ERROR_VPU_DECODE);
        }


        if ((ret = ctx->decode_getframe(ctx, pOut)) != 0) {
            printf("get decoded data failed\n");
            DECODE_ERR_RET(ERROR_VPU_DECODE);
        } else {
            printf("vpu decode one frame, out len: %d, left size: %d\n",
                   pOut->size, pkt->size);

            /*
             ** both virtual and physical address of the decoded frame are contained
             ** in structure named VPU_FRAME, if you want to use virtual address, make
             ** sure you have done VPUMemLink before.
            */
            if ((pOut->size) && (pOut->data)) {
                frame = (VPU_FRAME *)(pOut->data);
                vpuapi_mem_link(&frame->vpumem);
                wAlign16 = ((frame->DisplayWidth + 15) & (~15));
                hAlign16 = ((frame->DisplayHeight + 15) & (~15));
                frameSize = wAlign16 * hAlign16 * 3 / 2;

                if (pOutFile && (frame_count++ < cmd->record_frames)) {
                    printf("write %d frame(yuv420sp) data, %d bytes to file\n",
                           frame_count, frameSize);

                    fwrite((RK_U8 *)(frame->vpumem.vir_addr), 1, frameSize, pOutFile);
                    fflush(pOutFile);
                }

                /*
                 ** remember use VPUFreeLinear to free, other wise memory leak will
                 ** give you a surprise.
                */
                vpuapi_mem_free(&frame->vpumem);
                // NOTE: pOut->data is malloc from vpu_api we need to free it.
                free(pOut->data);
                pOut->data = NULL;
                pOut->size = 0;
            }
        }

        usleep(3000);
    } while (!(ctx->decoder_err));

DECODE_OUT:
    if (pkt && pkt->data) {
        free(pkt->data);
        pkt->data = NULL;
    }
    if (pOut && (pOut->data)) {
        free(pOut->data);
        pOut->data = NULL;
    }
    if (pExtra) {
        free(pExtra);
        pExtra = NULL;
    }
    if (ctx) {
        vpuapi_close_ctx(&ctx);
        ctx = NULL;
    }
    if (pInFile) {
        fclose(pInFile);
        pInFile = NULL;
    }
    if (pOutFile) {
        fclose(pOutFile);
        pOutFile = NULL;
    }

    if (ret) {
        printf("decode demo fail, err: %d\n", ret);
    } else {
        printf("encode demo complete OK.\n");
    }
    return ret;
}